

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zero-delay-observer.cpp
# Opt level: O2

void __thiscall
stateObservation::ZeroDelayObserver::pushInput(ZeroDelayObserver *this,InputVector *u_k)

{
  Deque *this_00;
  uint __line;
  int iVar1;
  size_type sVar2;
  TimeIndex k;
  char *__assertion;
  
  if ((this->super_ObserverBase).p_ < 1) {
    return;
  }
  iVar1 = (*(this->super_ObserverBase)._vptr_ObserverBase[0x1c])();
  if ((char)iVar1 == '\0') {
    __assertion = "checkInputVector(u_k) && \"The size of the input vector is incorrect\"";
    __line = 0x6e;
  }
  else {
    this_00 = &(this->u_).v_;
    sVar2 = std::
            deque<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_std::allocator<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>_>
            ::size(this_00);
    if (0 < (long)sVar2) {
      std::
      deque<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_std::allocator<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>_>
      ::push_back(this_00,u_k);
      return;
    }
    if ((this->x_).super_DebugItem<bool,_stateObservation::DebugItemDefaultValue<bool,_true>,_true>.
        b_ != false) {
      k = IndexedMatrixT<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_false>::getTime(&this->x_);
      IndexedMatrixArrayT<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_std::allocator<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>_>
      ::setValue(&this->u_,u_k,k);
      return;
    }
    __assertion = 
    "x_.isSet() && \"Unable to initialize input without time index, the state vector has not been set.\""
    ;
    __line = 0x76;
  }
  __assert_fail(__assertion,
                "/workspace/llm4binary/github/license_c_cmakelists/mehdi-benallegue[P]state-observation/src/zero-delay-observer.cpp"
                ,__line,
                "virtual void stateObservation::ZeroDelayObserver::pushInput(const ObserverBase::InputVector &)"
               );
}

Assistant:

void ZeroDelayObserver::pushInput(const ObserverBase::InputVector & u_k)
{
  if(p_ > 0)
  {
    BOOST_ASSERT(checkInputVector(u_k) && "The size of the input vector is incorrect");

    if(u_.size() > 0)
    {
      u_.pushBack(u_k);
    }
    else
    {
      BOOST_ASSERT(x_.isSet() && "Unable to initialize input without time index, the state vector has not been set.");
      /// we need the input at the time of the state vector to predict the next one
      u_.setValue(u_k, x_.getTime());
    }
  }
}